

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

_Bool fy_node_compare_user
                (fy_node *fyn1,fy_node *fyn2,fy_node_mapping_sort_fn sort_fn,void *sort_fn_arg,
                fy_node_scalar_compare_fn cmp_fn,void *cmp_fn_arg)

{
  fy_node_pair *pfVar1;
  fy_node_pair *pfVar2;
  fy_node *pfVar3;
  fy_node *pfVar4;
  bool bVar5;
  int count;
  int iVar6;
  size_t sVar7;
  fy_node_pair **fynpp;
  fy_node_pair **fynpp_00;
  fy_node_pair *pfStack_b0;
  bool local_a1;
  uint local_a0;
  bool local_9c;
  bool local_9b;
  bool local_9a;
  bool local_99;
  void *local_98;
  fy_node_cmp_arg def_arg;
  _Bool alias2;
  _Bool alias1;
  int count2;
  int count1;
  int i;
  fy_node_pair **fynpp2;
  fy_node_pair **fynpp1;
  _Bool null2;
  _Bool null1;
  _Bool ret;
  fy_node_pair *fynp2;
  fy_node_pair *fynp1;
  fy_node *fyni2;
  fy_node *fyni1;
  void *cmp_fn_arg_local;
  fy_node_scalar_compare_fn cmp_fn_local;
  void *sort_fn_arg_local;
  fy_node_mapping_sort_fn sort_fn_local;
  fy_node *fyn2_local;
  fy_node *fyn1_local;
  
  fyni1 = (fy_node *)cmp_fn_arg;
  cmp_fn_arg_local = cmp_fn;
  if (cmp_fn == (fy_node_scalar_compare_fn)0x0) {
    cmp_fn_arg_local = fy_node_scalar_cmp_default;
    fyni1 = (fy_node *)0x0;
  }
  if (sort_fn == (fy_node_mapping_sort_fn)0x0) {
    sort_fn_arg_local = fy_node_mapping_sort_cmp_default;
    local_98 = cmp_fn_arg_local;
    def_arg.cmp_fn = (fy_node_scalar_compare_fn)fyni1;
    cmp_fn_local = (fy_node_scalar_compare_fn)&local_98;
  }
  else {
    local_98 = (void *)0x0;
    def_arg.cmp_fn = (fy_node_scalar_compare_fn)0x0;
    cmp_fn_local = (fy_node_scalar_compare_fn)sort_fn_arg;
    sort_fn_arg_local = sort_fn;
  }
  if (fyn1 == fyn2) {
    fyn1_local._7_1_ = true;
  }
  else {
    local_99 = true;
    if (fyn1 != (fy_node *)0x0) {
      local_9a = false;
      if ((fyn1->field_0x34 & 3) == 0) {
        pfStack_b0 = (fy_node_pair *)0x1273c0;
        sVar7 = fy_token_get_text_length((fyn1->field_12).scalar);
        local_9a = sVar7 == 0;
      }
      local_99 = local_9a;
    }
    bVar5 = local_99;
    local_9b = true;
    if (fyn2 != (fy_node *)0x0) {
      local_9c = false;
      if ((fyn2->field_0x34 & 3) == 0) {
        pfStack_b0 = (fy_node_pair *)0x127419;
        sVar7 = fy_token_get_text_length((fyn2->field_12).scalar);
        local_9c = sVar7 == 0;
      }
      local_9b = local_9c;
    }
    if ((bVar5 == false) || (local_9b == false)) {
      if ((bVar5 == false) && (local_9b == false)) {
        if ((fyn1->field_0x34 & 3) == (fyn2->field_0x34 & 3)) {
          fynpp1._7_1_ = true;
          local_a0 = (byte)fyn1->field_0x34 & 3;
          if ((fyn1->field_0x34 & 3) == 0) {
            pfStack_b0 = (fy_node_pair *)0x1276af;
            def_arg.arg._3_1_ = fy_node_is_alias(fyn1);
            pfStack_b0 = (fy_node_pair *)0x1276bd;
            def_arg.arg._2_1_ = fy_node_is_alias(fyn2);
            if ((def_arg.arg._3_1_ & 1) != def_arg.arg._2_1_) {
              return false;
            }
            pfStack_b0 = (fy_node_pair *)0x1276ef;
            iVar6 = (*(code *)cmp_fn_arg_local)(fyn1,fyn2,fyni1);
            fynpp1._7_1_ = iVar6 == 0;
          }
          else if (local_a0 == 1) {
            pfStack_b0 = (fy_node_pair *)0x1274d8;
            fyni2 = fy_node_list_head(&(fyn1->field_12).sequence);
            pfStack_b0 = (fy_node_pair *)0x1274e9;
            for (fynp1 = (fy_node_pair *)fy_node_list_head(&(fyn2->field_12).sequence);
                local_a1 = fyni2 != (fy_node *)0x0 && fynp1 != (fy_node_pair *)0x0,
                fyni2 != (fy_node *)0x0 && fynp1 != (fy_node_pair *)0x0;
                fynp1 = (fy_node_pair *)fy_node_next(&(fyn2->field_12).sequence,(fy_node *)fynp1)) {
              pfStack_b0 = (fy_node_pair *)0x127523;
              fynpp1._7_1_ = fy_node_compare(fyni2,(fy_node *)fynp1);
              if (!fynpp1._7_1_) break;
              pfStack_b0 = (fy_node_pair *)0x127541;
              fyni2 = fy_node_next(&(fyn1->field_12).sequence,fyni2);
              pfStack_b0 = (fy_node_pair *)0x127556;
            }
            if (((fynpp1._7_1_ != false) && (fyni2 != (fy_node *)fynp1)) &&
               ((fyni2 == (fy_node *)0x0 || (fynp1 == (fy_node_pair *)0x0)))) {
              fynpp1._7_1_ = false;
            }
          }
          else if (local_a0 == 2) {
            pfStack_b0 = (fy_node_pair *)0x12758c;
            iVar6 = fy_node_mapping_item_count(fyn1);
            pfStack_b0 = (fy_node_pair *)0x127598;
            def_arg.arg._4_4_ = fy_node_mapping_item_count(fyn2);
            if (iVar6 == def_arg.arg._4_4_) {
              fynpp = (fy_node_pair **)
                      (&stack0xffffffffffffff58 + -((long)iVar6 * 8 + 0x17U & 0xfffffffffffffff0));
              fynpp_00 = (fy_node_pair **)
                         ((long)fynpp - ((long)def_arg.arg._4_4_ * 8 + 0x17U & 0xfffffffffffffff0));
              fynpp_00[-1] = (fy_node_pair *)0x1275ff;
              fy_node_mapping_perform_sort
                        (fyn1,(fy_node_mapping_sort_fn)sort_fn_arg_local,cmp_fn_local,fynpp,iVar6);
              count = def_arg.arg._4_4_;
              fynpp_00[-1] = (fy_node_pair *)0x127618;
              fy_node_mapping_perform_sort
                        (fyn2,(fy_node_mapping_sort_fn)sort_fn_arg_local,cmp_fn_local,fynpp_00,count
                        );
              for (count2 = 0; count2 < iVar6; count2 = count2 + 1) {
                pfVar1 = fynpp[count2];
                pfVar2 = fynpp_00[count2];
                pfVar3 = pfVar1->key;
                pfVar4 = pfVar2->key;
                fynpp_00[-1] = (fy_node_pair *)0x12765c;
                fynpp1._7_1_ = fy_node_compare(pfVar3,pfVar4);
                if (!fynpp1._7_1_) break;
                pfVar3 = pfVar1->value;
                pfVar4 = pfVar2->value;
                fynpp_00[-1] = (fy_node_pair *)0x12767e;
                fynpp1._7_1_ = fy_node_compare(pfVar3,pfVar4);
                if (!fynpp1._7_1_) break;
              }
              if (iVar6 <= count2) {
                fynpp1._7_1_ = true;
              }
            }
            else {
              fynpp1._7_1_ = false;
            }
          }
          fyn1_local._7_1_ = fynpp1._7_1_;
        }
        else {
          fyn1_local._7_1_ = false;
        }
      }
      else {
        fyn1_local._7_1_ = false;
      }
    }
    else {
      fyn1_local._7_1_ = true;
    }
  }
  return fyn1_local._7_1_;
}

Assistant:

bool fy_node_compare_user(struct fy_node *fyn1, struct fy_node *fyn2,
                          fy_node_mapping_sort_fn sort_fn, void *sort_fn_arg,
                          fy_node_scalar_compare_fn cmp_fn, void *cmp_fn_arg) {
    struct fy_node *fyni1, *fyni2;
    struct fy_node_pair *fynp1, *fynp2;
    bool ret, null1, null2;
    struct fy_node_pair **fynpp1, **fynpp2;
    int i, count1, count2;
    bool alias1, alias2;
    struct fy_node_cmp_arg def_arg;

    if (!cmp_fn) {
        cmp_fn = fy_node_scalar_cmp_default;
        cmp_fn_arg = NULL;
    }
    if (!sort_fn) {
        sort_fn = fy_node_mapping_sort_cmp_default;
        def_arg.cmp_fn = cmp_fn;
        def_arg.arg = cmp_fn_arg;
        sort_fn_arg = &def_arg;
    } else {
        def_arg.cmp_fn = NULL;
        def_arg.arg = NULL;
    }
    /* equal pointers? */
    if (fyn1 == fyn2)
        return true;

    null1 = !fyn1 || (fyn1->type == FYNT_SCALAR && fy_token_get_text_length(fyn1->scalar) == 0);
    null2 = !fyn2 || (fyn2->type == FYNT_SCALAR && fy_token_get_text_length(fyn2->scalar) == 0);

    /* both null */
    if (null1 && null2)
        return true;

    /* either is NULL, no match */
    if (null1 || null2)
        return false;

    /* types must match */
    if (fyn1->type != fyn2->type)
        return false;

    ret = true;

    switch (fyn1->type) {
        case FYNT_SEQUENCE:
            fyni1 = fy_node_list_head(&fyn1->sequence);
            fyni2 = fy_node_list_head(&fyn2->sequence);
            while (fyni1 && fyni2) {

                ret = fy_node_compare(fyni1, fyni2);
                if (!ret)
                    break;

                fyni1 = fy_node_next(&fyn1->sequence, fyni1);
                fyni2 = fy_node_next(&fyn2->sequence, fyni2);
            }
            if (ret && fyni1 != fyni2 && (!fyni1 || !fyni2))
                ret = false;

            break;

        case FYNT_MAPPING:
            count1 = fy_node_mapping_item_count(fyn1);
            count2 = fy_node_mapping_item_count(fyn2);

            /* mapping counts must match */
            if (count1 != count2) {
                ret = false;
                break;
            }

            fynpp1 = alloca(sizeof(*fynpp1) * (count1 + 1));
            fynpp2 = alloca(sizeof(*fynpp2) * (count2 + 1));

            fy_node_mapping_perform_sort(fyn1, sort_fn, sort_fn_arg, fynpp1, count1);
            fy_node_mapping_perform_sort(fyn2, sort_fn, sort_fn_arg, fynpp2, count2);

            for (i = 0; i < count1; i++) {
                fynp1 = fynpp1[i];
                fynp2 = fynpp2[i];

                ret = fy_node_compare(fynp1->key, fynp2->key);
                if (!ret)
                    break;

                ret = fy_node_compare(fynp1->value, fynp2->value);
                if (!ret)
                    break;
            }
            if (i >= count1)
                ret = true;

            break;

        case FYNT_SCALAR:
            alias1 = fy_node_is_alias(fyn1);
            alias2 = fy_node_is_alias(fyn2);

            /* either both must be aliases or both not */
            if (alias1 != alias2)
                return false;

            ret = !cmp_fn(fyn1, fyn2, cmp_fn_arg);
            break;
    }

    return ret;
}